

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O2

void __thiscall JetHead::list<Event_*>::iterator::insertAfter(iterator *this,Event **val)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar3 = (Node *)operator_new(0x18);
  pNVar3->val = *val;
  pNVar1 = this->mNode;
  pNVar3->prev = pNVar1;
  pNVar2 = pNVar1->next;
  pNVar3->next = pNVar2;
  pNVar2->prev = pNVar3;
  pNVar1->next = pNVar3;
  return;
}

Assistant:

void insertAfter(const T& val)
			{
				Node* newNode = new Node;
				newNode->val = val;
				newNode->prev = mNode;
				newNode->next = mNode->next;

				mNode->next->prev = newNode;
				mNode->next = newNode;
			}